

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O0

Vec_Int_t * Iso_ManFinalize(Iso_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  Iso_Obj_t *pIVar5;
  Vec_Int_t *p_00;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vRes;
  Iso_Man_t *p_local;
  
  if (p->nClasses != 0) {
    __assert_fail("p->nClasses == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                  ,0x444,"Vec_Int_t *Iso_ManFinalize(Iso_Man_t *)");
  }
  iVar1 = Vec_PtrSize(p->vClasses);
  if (iVar1 == 0) {
    local_24 = 0;
    do {
      iVar1 = Vec_PtrSize(p->pAig->vObjs);
      if (iVar1 <= local_24) {
        pAVar4 = Aig_ManConst1(p->pAig);
        (pAVar4->field_5).iData = 0;
        Vec_PtrClear(p->vTemp1);
        Vec_PtrClear(p->vTemp2);
        local_24 = 0;
        while( true ) {
          iVar1 = Vec_PtrSize(p->pAig->vCis);
          if (iVar1 <= local_24) {
            Vec_PtrSort(p->vTemp1,Iso_ObjCompareByData);
            Vec_PtrSort(p->vTemp2,Iso_ObjCompareByData);
            iVar1 = Aig_ManCiNum(p->pAig);
            p_00 = Vec_IntAlloc(iVar1);
            for (local_24 = 0; iVar1 = Vec_PtrSize(p->vTemp1), local_24 < iVar1;
                local_24 = local_24 + 1) {
              pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vTemp1,local_24);
              iVar1 = Aig_ObjCioId(pAVar4);
              Vec_IntPush(p_00,iVar1);
            }
            for (local_24 = 0; iVar1 = Vec_PtrSize(p->vTemp2), local_24 < iVar1;
                local_24 = local_24 + 1) {
              pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vTemp2,local_24);
              iVar1 = Aig_ObjCioId(pAVar4);
              Vec_IntPush(p_00,iVar1);
            }
            return p_00;
          }
          pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,local_24);
          if ((pAVar4->field_5).iData < 1) break;
          iVar1 = Aig_ObjCioId(pAVar4);
          iVar2 = Aig_ManCiNum(p->pAig);
          iVar3 = Aig_ManRegNum(p->pAig);
          if (iVar1 < iVar2 - iVar3) {
            Vec_PtrPush(p->vTemp1,pAVar4);
          }
          else {
            Vec_PtrPush(p->vTemp2,pAVar4);
          }
          local_24 = local_24 + 1;
        }
        __assert_fail("pObj->iData > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                      ,0x457,"Vec_Int_t *Iso_ManFinalize(Iso_Man_t *)");
      }
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,local_24);
      if (pAVar4 != (Aig_Obj_t *)0x0) {
        iVar1 = Aig_ObjIsCi(pAVar4);
        if ((iVar1 == 0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 == 0)) {
          (pAVar4->field_5).iData = -1;
        }
        else {
          iVar1 = Aig_ObjId(pAVar4);
          pIVar5 = Iso_ManObj(p,iVar1);
          (pAVar4->field_5).iData = pIVar5->Id;
          if ((pAVar4->field_5).iData < 1) {
            __assert_fail("pObj->iData > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                          ,0x44f,"Vec_Int_t *Iso_ManFinalize(Iso_Man_t *)");
          }
        }
      }
      local_24 = local_24 + 1;
    } while( true );
  }
  __assert_fail("Vec_PtrSize(p->vClasses) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                ,0x445,"Vec_Int_t *Iso_ManFinalize(Iso_Man_t *)");
}

Assistant:

Vec_Int_t * Iso_ManFinalize( Iso_Man_t * p )
{
    Vec_Int_t * vRes;
    Aig_Obj_t * pObj;
    int i;
    assert( p->nClasses == 0 );
    assert( Vec_PtrSize(p->vClasses) == 0 );
    // set canonical numbers
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
        {
            pObj->iData = -1;
            continue;
        }
        pObj->iData = Iso_ManObj(p, Aig_ObjId(pObj))->Id;
        assert( pObj->iData > 0 );
    }
    Aig_ManConst1(p->pAig)->iData = 0;
    // assign unique IDs to the CIs
    Vec_PtrClear( p->vTemp1 );
    Vec_PtrClear( p->vTemp2 );
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        assert( pObj->iData > 0 );
        if ( Aig_ObjCioId(pObj) >= Aig_ManCiNum(p->pAig) - Aig_ManRegNum(p->pAig) ) // flop
            Vec_PtrPush( p->vTemp2, pObj );
        else // PI
            Vec_PtrPush( p->vTemp1, pObj );
    }
    // sort CIs by their IDs
    Vec_PtrSort( p->vTemp1, (int (*)(void))Iso_ObjCompareByData );
    Vec_PtrSort( p->vTemp2, (int (*)(void))Iso_ObjCompareByData );
    // create the result
    vRes = Vec_IntAlloc( Aig_ManCiNum(p->pAig) );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vTemp1, pObj, i )
        Vec_IntPush( vRes, Aig_ObjCioId(pObj) );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vTemp2, pObj, i )
        Vec_IntPush( vRes, Aig_ObjCioId(pObj) );
    return vRes;
}